

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_modelWithUnresolvedImports_Test::ModelFlattening_modelWithUnresolvedImports_Test
          (ModelFlattening_modelWithUnresolvedImports_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0016a3d8;
  return;
}

Assistant:

TEST(ModelFlattening, modelWithUnresolvedImports)
{
    const std::string modelImportingUnits =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"importer_of_units\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"unitsdefinitions.xml\">\n"
        "    <units units_ref=\"ms\" name=\"my_ms\"/>\n"
        "  </import>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto modelWithUnitsImports = parser->parseModel(modelImportingUnits);

    EXPECT_TRUE(modelWithUnitsImports->hasUnresolvedImports());

    auto importer = libcellml::Importer::create();
    auto flatModel = importer->flattenModel(modelWithUnitsImports);

    EXPECT_EQ(nullptr, flatModel);
}